

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GLSL420Pack::BindingUniformDefaultTest::checkResults
          (BindingUniformDefaultTest *this,program *program)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestError *this_00;
  GLint binding;
  int local_24;
  long lVar3;
  
  iVar1 = (*((this->super_APITestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = (**(code **)(lVar3 + 0xb38))(program->m_program_object_id,"GOKU");
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetUniformBlockIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x22a1);
  if (iVar1 != -1) {
    local_24 = -1;
    (**(code **)(lVar3 + 0x760))(program->m_program_object_id,iVar1,0x8a3f,&local_24);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"GetActiveUniformBlockiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x22ab);
    return local_24 == 0;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Uniform block is inactive",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x22a4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool BindingUniformDefaultTest::checkResults(Utils::program& program)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const GLuint index = gl.getUniformBlockIndex(program.m_program_object_id, "GOKU");
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformBlockIndex");
	if (GL_INVALID_INDEX == index)
	{
		TCU_FAIL("Uniform block is inactive");
		return false;
	}

	GLint binding = -1;

	gl.getActiveUniformBlockiv(program.m_program_object_id, index, GL_UNIFORM_BLOCK_BINDING, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformBlockiv");

	if (0 != binding)
	{
		return false;
	}

	return true;
}